

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  char *pcVar2;
  ParseResult PVar3;
  ulong uStack_20;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
  uStack_20 = (ulong)*(uint *)(this + 0x30);
  if (*(uint *)(this + 0x30) != 0) goto LAB_00113c4c;
  pcVar2 = is->src_;
  if (*pcVar2 == '\0') {
    uStack_20 = 1;
  }
  else {
    ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    uStack_20 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_00113c4c;
    SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
    uStack_20 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_00113c4c;
    pcVar2 = is->src_;
    uStack_20 = 0;
    if (*pcVar2 == '\0') goto LAB_00113c4c;
    uStack_20 = 2;
  }
  pCVar1 = is->head_;
  *(int *)(this + 0x30) = (int)uStack_20;
  *(long *)(this + 0x38) = (long)pcVar2 - (long)pCVar1;
LAB_00113c4c:
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar3.offset_ = *(size_t *)(this + 0x38);
  PVar3._0_8_ = uStack_20;
  return PVar3;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }